

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,REF_INT *nodes,REF_INT *ntri)

{
  uint uVar1;
  uint uVar2;
  REF_INT cell;
  REF_INT face [3];
  int local_38;
  REF_INT local_34;
  REF_INT local_30;
  REF_INT local_2c;
  
  *ntri = 0;
  local_34 = nodes[1];
  local_30 = nodes[2];
  local_2c = nodes[3];
  uVar1 = ref_cell_with(ref_cell,&local_34,&local_38);
  if ((uVar1 == 0) || (uVar1 == 5)) {
    if (local_38 != -1) {
      *ntri = *ntri + 1;
    }
    local_34 = *nodes;
    local_30 = nodes[2];
    local_2c = nodes[3];
    uVar2 = ref_cell_with(ref_cell,&local_34,&local_38);
    if ((uVar2 != 0) && (uVar2 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x48a,
             "ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
      uVar1 = uVar2;
    }
    if ((uVar2 == 5) || (uVar2 == 0)) {
      if (local_38 != -1) {
        *ntri = *ntri + 1;
      }
      local_34 = *nodes;
      local_30 = nodes[3];
      local_2c = nodes[1];
      uVar2 = ref_cell_with(ref_cell,&local_34,&local_38);
      if ((uVar2 != 0) && (uVar2 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x490,"ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
        uVar1 = uVar2;
      }
      if ((uVar2 == 5) || (uVar2 == 0)) {
        if (local_38 != -1) {
          *ntri = *ntri + 1;
        }
        local_34 = *nodes;
        local_30 = nodes[1];
        local_2c = nodes[2];
        uVar2 = ref_cell_with(ref_cell,&local_34,&local_38);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x496,"ref_cell_ntri_with_tet_nodes",(ulong)uVar2,"t0");
          uVar1 = uVar2;
        }
        if (((uVar2 == 5) || (uVar2 == 0)) && (uVar1 = 0, local_38 != -1)) {
          *ntri = *ntri + 1;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x484,
           "ref_cell_ntri_with_tet_nodes",(ulong)uVar1,"t0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,
                                                REF_INT *nodes, REF_INT *ntri) {
  REF_INT face[3], cell;

  *ntri = 0;

  face[0] = nodes[1];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[1];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[2];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  return REF_SUCCESS;
}